

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int doTests(string *name,float ref)

{
  __tuple_element_t<0UL,_tuple<ComputeBackends,_int,_basic_string<char>_>_> Backend;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  __tuple_element_t<2UL,_tuple<ComputeBackends,_int,_basic_string<char>_>_> *__rhs;
  __tuple_element_t<0UL,_tuple<ComputeBackends,_int,_basic_string<char>_>_> *p_Var4;
  __tuple_element_t<1UL,_tuple<ComputeBackends,_int,_basic_string<char>_>_> *p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_3c;
  reference local_38;
  tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *b;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  int count;
  float ref_local;
  string *name_local;
  
  __range1._0_4_ = 0;
  __end1 = std::
           vector<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&backends_abi_cxx11_);
  b = (tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         vector<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&backends_abi_cxx11_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&b);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1);
    indk::NeuralNet::doReset(NN);
    local_3c = (int)std::setw(0x32);
    poVar3 = std::operator<<((ostream *)&std::cout,(_Setw)local_3c);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::left);
    std::operator+(&local_a0,name," (");
    __rhs = std::get<2ul,indk::System::ComputeBackends,int,std::__cxx11::string>(local_38);
    std::operator+(&local_80,&local_a0,__rhs);
    std::operator+(&local_60,&local_80,"): ");
    std::operator<<(poVar3,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    p_Var4 = std::get<0ul,indk::System::ComputeBackends,int,std::__cxx11::string>(local_38);
    Backend = *p_Var4;
    p_Var5 = std::get<1ul,indk::System::ComputeBackends,int,std::__cxx11::string>(local_38);
    indk::System::setComputeBackend(Backend,*p_Var5);
    iVar2 = doTest(ref);
    __range1._0_4_ = iVar2 + (int)__range1;
    __gnu_cxx::
    __normal_iterator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return (int)__range1;
}

Assistant:

int doTests(const std::string& name, float ref) {
    int count = 0;

    for (auto &b: backends) {
        NN -> doReset();
        std::cout << std::setw(50) << std::left << name+" ("+std::get<2>(b)+"): ";
        indk::System::setComputeBackend(std::get<0>(b), std::get<1>(b));
        count += doTest(ref);
    }
    std::cout << std::endl;

    return count;
}